

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CCDPP_MPI.h
# Opt level: O1

value_type_conflict1 __thiscall
CCDPP_MPI::update_rating
          (CCDPP_MPI *this,
          unordered_map<int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
          *_R,value_type_conflict1 *_q4d,value_type_conflict1 *_global_p4d,int start_q_id,
          int workload,bool add)

{
  pool *ppVar1;
  double *pdVar2;
  int iVar3;
  double dVar4;
  int size;
  value_type_conflict1 flag;
  vector<double,_std::allocator<double>_> loss;
  undefined4 local_8c;
  int local_88;
  int local_84;
  long local_80;
  value_type_conflict1 *local_78;
  value_type_conflict1 *local_70;
  vector<double,_std::allocator<double>_> local_68;
  function0<void> local_50;
  
  local_8c = (undefined4)(_R->_M_h)._M_element_count;
  local_50.super_function_base.vtable = (vtable_base *)0x0;
  local_88 = workload;
  local_84 = start_q_id;
  local_78 = _global_p4d;
  local_70 = _q4d;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_68,(long)this->parameter->num_of_thread,(value_type_conflict1 *)&local_50,
             (allocator_type *)&local_80);
  local_80 = (ulong)add * 0x3ff0000000000000 + (ulong)!add * -0x4010000000000000;
  if (0 < this->parameter->num_of_thread) {
    iVar3 = 0;
    do {
      ppVar1 = this->thread_pool;
      local_50.super_function_base.vtable = (vtable_base *)0x0;
      local_50.super_function_base.functor.members.obj_ref.obj_ptr = operator_new(0x48);
      *(int **)local_50.super_function_base.functor.members._0_8_ = &local_88;
      *(undefined4 **)((long)local_50.super_function_base.functor.members._0_8_ + 8) = &local_8c;
      *(unordered_map<int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
        **)((long)local_50.super_function_base.functor.members._0_8_ + 0x10) = _R;
      *(int **)((long)local_50.super_function_base.functor.members._0_8_ + 0x18) = &local_84;
      *(long **)((long)local_50.super_function_base.functor.members._0_8_ + 0x20) = &local_80;
      *(value_type_conflict1 ***)((long)local_50.super_function_base.functor.members._0_8_ + 0x28) =
           &local_70;
      *(value_type_conflict1 ***)((long)local_50.super_function_base.functor.members._0_8_ + 0x30) =
           &local_78;
      *(vector<double,_std::allocator<double>_> **)
       ((long)local_50.super_function_base.functor.members._0_8_ + 0x38) = &local_68;
      *(int *)((long)local_50.super_function_base.functor.members._0_8_ + 0x40) = iVar3;
      local_50.super_function_base.vtable =
           (vtable_base *)
           _ZZN5boost9function0IvE9assign_toISt5_BindIFZN9CCDPP_MPI13update_ratingERSt13unordered_mapIiSt6vectorISt4pairIidESaIS8_EESt4hashIiESt8equal_toIiESaIS7_IKiSA_EEEPdSK_iibEUliE_iEEEEvT_E13stored_vtable
      ;
      boost::threadpool::detail::
      pool_core<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>
      ::schedule((ppVar1->m_core).px,&local_50);
      boost::function0<void>::~function0(&local_50);
      iVar3 = iVar3 + 1;
    } while (iVar3 < this->parameter->num_of_thread);
  }
  boost::threadpool::detail::
  pool_core<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>
  ::wait((this->thread_pool->m_core).px,(void *)0x0);
  dVar4 = 0.0;
  for (pdVar2 = local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      pdVar2 != local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish; pdVar2 = pdVar2 + 1) {
    dVar4 = dVar4 + *pdVar2;
  }
  if (local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return dVar4;
}

Assistant:

inline value_type update_rating(unordered_map<int, vector<pair<int, value_type > > > &_R, value_type *_q4d, value_type *_global_p4d,
                  const int start_q_id, const int workload, bool add) {

        int size = _R.size();

        vector<value_type> loss(parameter->num_of_thread, 0);

        value_type flag = add ? 1 : -1;

        for(int thread_index=0;thread_index<parameter->num_of_thread;thread_index++){
            thread_pool->schedule(std::bind([&](const int thread_index) {
                int start = workload * thread_index;
                int end = std::min(workload + start, size);

                for (int q_index = start; q_index < end; q_index++) {
                    vector<pair<int, value_type > > &vec = _R[q_index + start_q_id];
                    for (int i = 0; i < vec.size(); i++) {
                        pair<int, value_type > &p =  vec[i];
                        p.second += flag * _q4d[q_index] * _global_p4d[p.first];
                        loss[thread_index] += p.second * p.second;
                    }
                }
            }, thread_index));
        }

        thread_pool->wait();

        value_type total_loss = 0;
        for (auto l:loss) {
            total_loss += l;
        }
        return total_loss;
    }